

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JwtStrategy.cpp
# Opt level: O3

Url * __thiscall
Vault::JwtStrategy::getUrl(Url *__return_storage_ptr__,JwtStrategy *this,Client *client,Path *path)

{
  string local_40;
  
  Vault::operator+(&local_40,"/v1/auth/",&this->mount_);
  (*client->_vptr_Client[3])(__return_storage_ptr__,client,&local_40,path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::JwtStrategy::getUrl(const Vault::Client &client,
                                      const Vault::Path &path) {
  return client.getUrl("/v1/auth/" + mount_, path);
}